

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__resample_horizontal_downsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  stbir__contributors *psVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  
  if (1.0 < stbir_info->horizontal_scale) {
    __assert_fail("!stbir__use_width_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x601,"void stbir__resample_horizontal_downsample(stbir__info *, float *)");
  }
  uVar2 = stbir_info->channels;
  lVar12 = (long)(int)uVar2;
  pfVar14 = stbir_info->decode_buffer;
  iVar13 = stbir_info->horizontal_filter_pixel_margin;
  lVar7 = (long)iVar13;
  lVar17 = (long)(int)(iVar13 * uVar2);
  psVar4 = stbir_info->horizontal_contributors;
  pfVar5 = stbir_info->horizontal_coefficients;
  iVar3 = stbir_info->horizontal_coefficient_width;
  uVar9 = iVar13 * 2 + stbir_info->input_w;
  switch(uVar2) {
  case 1:
    if (0 < (int)uVar9) {
      iVar13 = 0;
      uVar11 = 0;
      do {
        iVar10 = psVar4[uVar11].n0;
        iVar6 = psVar4[uVar11].n1;
        if (iVar10 <= iVar6) {
          lVar12 = 0;
          do {
            fVar1 = pfVar5[iVar13 + (int)lVar12];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x613,
                            "void stbir__resample_horizontal_downsample(stbir__info *, float *)");
            }
            output_buffer[iVar10 + lVar12] =
                 fVar1 * pfVar14[lVar17 + (uVar11 - lVar7)] + output_buffer[iVar10 + lVar12];
            lVar12 = lVar12 + 1;
          } while ((iVar6 - iVar10) + 1 != (int)lVar12);
        }
        uVar11 = uVar11 + 1;
        iVar13 = iVar13 + iVar3;
      } while (uVar11 != uVar9);
    }
    break;
  case 2:
    if (0 < (int)uVar9) {
      iVar13 = 0;
      uVar11 = 0;
      do {
        iVar10 = psVar4[uVar11].n0;
        lVar12 = (long)iVar10;
        iVar6 = psVar4[uVar11].n1;
        if (iVar10 <= iVar6) {
          lVar15 = 0;
          do {
            fVar1 = pfVar5[iVar13 + (int)lVar15];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x628,
                            "void stbir__resample_horizontal_downsample(stbir__info *, float *)");
            }
            output_buffer[lVar12 * 2 + lVar15 * 2] =
                 pfVar14[lVar17 + (uVar11 - lVar7) * 2] * fVar1 +
                 output_buffer[lVar12 * 2 + lVar15 * 2];
            output_buffer[lVar12 * 2 + lVar15 * 2 + 1] =
                 fVar1 * pfVar14[lVar17 + (uVar11 - lVar7) * 2 + 1] +
                 output_buffer[lVar12 * 2 + lVar15 * 2 + 1];
            lVar15 = lVar15 + 1;
          } while ((iVar6 - iVar10) + 1 != (int)lVar15);
        }
        uVar11 = uVar11 + 1;
        iVar13 = iVar13 + iVar3;
      } while (uVar11 != uVar9);
    }
    break;
  case 3:
    if (0 < (int)uVar9) {
      iVar13 = 0;
      uVar11 = 0;
      do {
        iVar10 = psVar4[uVar11].n0;
        if (iVar10 <= psVar4[uVar11].n1) {
          lVar12 = uVar11 - lVar7;
          pfVar16 = output_buffer + (long)iVar10 * 3 + 2;
          iVar6 = (psVar4[uVar11].n1 - iVar10) + 1;
          iVar10 = iVar13;
          do {
            fVar1 = pfVar5[iVar10];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x63e,
                            "void stbir__resample_horizontal_downsample(stbir__info *, float *)");
            }
            pfVar16[-2] = pfVar14[lVar17 + lVar12 * 3] * fVar1 + pfVar16[-2];
            pfVar16[-1] = pfVar14[lVar17 + lVar12 * 3 + 1] * fVar1 + pfVar16[-1];
            *pfVar16 = fVar1 * pfVar14[lVar17 + lVar12 * 3 + 2] + *pfVar16;
            pfVar16 = pfVar16 + 3;
            iVar10 = iVar10 + 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar11 = uVar11 + 1;
        iVar13 = iVar13 + iVar3;
      } while (uVar11 != uVar9);
    }
    break;
  case 4:
    if (0 < (int)uVar9) {
      iVar13 = 0;
      uVar11 = 0;
      do {
        iVar10 = psVar4[uVar11].n0;
        if (iVar10 <= psVar4[uVar11].n1) {
          lVar12 = uVar11 - lVar7;
          pfVar16 = output_buffer + (long)iVar10 * 4 + 3;
          iVar6 = (psVar4[uVar11].n1 - iVar10) + 1;
          iVar10 = iVar13;
          do {
            fVar1 = pfVar5[iVar10];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x655,
                            "void stbir__resample_horizontal_downsample(stbir__info *, float *)");
            }
            pfVar16[-3] = pfVar14[lVar17 + lVar12 * 4] * fVar1 + pfVar16[-3];
            pfVar16[-2] = pfVar14[lVar17 + lVar12 * 4 + 1] * fVar1 + pfVar16[-2];
            pfVar16[-1] = pfVar14[lVar17 + lVar12 * 4 + 2] * fVar1 + pfVar16[-1];
            *pfVar16 = fVar1 * pfVar14[lVar17 + lVar12 * 4 + 3] + *pfVar16;
            pfVar16 = pfVar16 + 4;
            iVar10 = iVar10 + 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar11 = uVar11 + 1;
        iVar13 = iVar13 + iVar3;
      } while (uVar11 != uVar9);
    }
    break;
  default:
    if (0 < (int)uVar9) {
      pfVar14 = pfVar14 + (lVar17 - lVar7 * lVar12);
      uVar11 = 0;
      do {
        iVar13 = psVar4[uVar11].n0;
        lVar7 = (long)iVar13;
        iVar10 = psVar4[uVar11].n1;
        if (iVar13 <= iVar10) {
          pfVar16 = (float *)(lVar12 * 4 * lVar7 + (long)output_buffer);
          do {
            fVar1 = pfVar5[((int)uVar11 * iVar3 - iVar13) + (int)lVar7];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x66e,
                            "void stbir__resample_horizontal_downsample(stbir__info *, float *)");
            }
            if (0 < (int)uVar2) {
              uVar8 = 0;
              do {
                pfVar16[uVar8] = pfVar14[uVar8] * fVar1 + pfVar16[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar2 != uVar8);
            }
            lVar7 = lVar7 + 1;
            pfVar16 = pfVar16 + lVar12;
          } while (iVar10 + 1 != (int)lVar7);
        }
        uVar11 = uVar11 + 1;
        pfVar14 = pfVar14 + lVar12;
      } while (uVar11 != uVar9);
    }
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_downsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int input_w = stbir_info->input_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;
    int filter_pixel_margin = stbir_info->horizontal_filter_pixel_margin;
    int max_x = input_w + filter_pixel_margin * 2;

    STBIR_ASSERT(!stbir__use_width_upsampling(stbir_info));

    switch (channels) {
        case 1:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 1;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
            }
            break;

        case 2:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 2;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
            }
            break;

        case 3:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 3;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
            }
            break;

        case 4:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 4;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
            }
            break;

        default:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * channels;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int c;
                    int out_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
            }
            break;
    }
}